

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_brodnik<unsigned_char_*> *bucket,size_t depth)

{
  uint16_t uVar1;
  uint uVar2;
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *this_00;
  size_t sVar3;
  uchar *puVar4;
  reference ppuVar5;
  reference pvVar6;
  vector_brodnik<unsigned_char_*> *pvVar7;
  vector_brodnik<unsigned_char_*> *sub_bucket_1;
  uchar *puStack_2e0;
  unsigned_short ch_1;
  uchar *ptr;
  vector_brodnik<unsigned_char_*> *sub_bucket;
  uint local_2c8;
  uint uStack_2c4;
  unsigned_short ch;
  uint j_1;
  uint j;
  array<unsigned_char_*,_64UL> strings;
  array<unsigned_short,_64UL> cache;
  uint i;
  uint bucket_size;
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *new_node;
  size_t depth_local;
  vector_brodnik<unsigned_char_*> *bucket_local;
  BurstSimple<unsigned_short> *this_local;
  
  this_00 = (TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_> *)operator_new(0x18);
  TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_>::TrieNode(this_00);
  sVar3 = vector_brodnik<unsigned_char_*>::size(bucket);
  uVar2 = (uint)sVar3;
  cache._M_elems[0x3c] = 0;
  cache._M_elems[0x3d] = 0;
  do {
    if (uVar2 - (uVar2 & 0x3f) <= (uint)cache._M_elems._120_4_) {
      while( true ) {
        if (uVar2 <= (uint)cache._M_elems._120_4_) {
          return this_00;
        }
        puStack_2e0 = vector_brodnik<unsigned_char_*>::operator[]
                                (bucket,(ulong)(uint)cache._M_elems._120_4_);
        uVar1 = get_char<unsigned_short>(puStack_2e0,depth);
        pvVar7 = TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_>::get_bucket
                           (this_00,(uint)uVar1);
        if (pvVar7 == (vector_brodnik<unsigned_char_*> *)0x0) break;
        vector_brodnik<unsigned_char_*>::push_back(pvVar7,&stack0xfffffffffffffd20);
        cache._M_elems._120_4_ = cache._M_elems._120_4_ + 1;
      }
      __assert_fail("sub_bucket",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                    ,0x80,
                    "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_brodnik<unsigned char *>]"
                   );
    }
    for (uStack_2c4 = 0; uStack_2c4 < 0x40; uStack_2c4 = uStack_2c4 + 1) {
      puVar4 = vector_brodnik<unsigned_char_*>::operator[]
                         (bucket,(ulong)(cache._M_elems._120_4_ + uStack_2c4));
      ppuVar5 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_2c4);
      *ppuVar5 = puVar4;
      ppuVar5 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)uStack_2c4);
      uVar1 = get_char<unsigned_short>(*ppuVar5,depth);
      pvVar6 = std::array<unsigned_short,_64UL>::operator[]
                         ((array<unsigned_short,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)uStack_2c4);
      *pvVar6 = uVar1;
    }
    for (local_2c8 = 0; local_2c8 < 0x40; local_2c8 = local_2c8 + 1) {
      pvVar6 = std::array<unsigned_short,_64UL>::operator[]
                         ((array<unsigned_short,_64UL> *)((long)strings._M_elems + 0x1fc),
                          (ulong)local_2c8);
      sub_bucket._6_2_ = *pvVar6;
      pvVar7 = TrieNode<unsigned_short,_vector_brodnik<unsigned_char_*>_>::get_bucket
                         (this_00,(uint)sub_bucket._6_2_);
      ptr = (uchar *)pvVar7;
      if (pvVar7 == (vector_brodnik<unsigned_char_*> *)0x0) {
        __assert_fail("sub_bucket",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort2.cpp"
                      ,0x78,
                      "TrieNode<CharT, BucketT> *BurstSimple<unsigned short>::operator()(const BucketT &, size_t) const [CharT = unsigned short, BucketT = vector_brodnik<unsigned char *>]"
                     );
      }
      ppuVar5 = std::array<unsigned_char_*,_64UL>::operator[]
                          ((array<unsigned_char_*,_64UL> *)&j_1,(ulong)local_2c8);
      vector_brodnik<unsigned_char_*>::push_back(pvVar7,ppuVar5);
    }
    cache._M_elems._120_4_ = cache._M_elems._120_4_ + 0x40;
  } while( true );
}

Assistant:

TrieNode<CharT, BucketT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT, BucketT>* new_node = new TrieNode<CharT, BucketT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			std::array<CharT, 64> cache;
			std::array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = new_node->get_bucket(ch);
				assert(sub_bucket);
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = new_node->get_bucket(ch);
			assert(sub_bucket);
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}